

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImGui::StyleColorsLight(ImGuiStyle *dst)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  if (dst == (ImGuiStyle *)0x0) {
    dst = GetStyle();
  }
  dst->Colors[0].x = 0.0;
  dst->Colors[0].y = 0.0;
  dst->Colors[0].z = 0.0;
  dst->Colors[0].w = 1.0;
  dst->Colors[1].x = 0.6;
  dst->Colors[1].y = 0.6;
  dst->Colors[1].z = 0.6;
  dst->Colors[1].w = 1.0;
  dst->Colors[2].x = 0.94;
  dst->Colors[2].y = 0.94;
  dst->Colors[2].z = 0.94;
  dst->Colors[2].w = 1.0;
  dst->Colors[3].x = 0.0;
  dst->Colors[3].y = 0.0;
  dst->Colors[3].z = 0.0;
  dst->Colors[3].w = 0.0;
  dst->Colors[4].x = 1.0;
  dst->Colors[4].y = 1.0;
  dst->Colors[4].z = 1.0;
  dst->Colors[4].w = 0.98;
  dst->Colors[5].x = 0.0;
  dst->Colors[5].y = 0.0;
  dst->Colors[5].z = 0.0;
  dst->Colors[5].w = 0.3;
  dst->Colors[6].x = 0.0;
  dst->Colors[6].y = 0.0;
  dst->Colors[6].z = 0.0;
  dst->Colors[6].w = 0.0;
  dst->Colors[7].x = 1.0;
  dst->Colors[7].y = 1.0;
  dst->Colors[7].z = 1.0;
  dst->Colors[7].w = 1.0;
  dst->Colors[8].x = 0.26;
  dst->Colors[8].y = 0.59;
  dst->Colors[8].z = 0.98;
  dst->Colors[8].w = 0.4;
  dst->Colors[9].x = 0.26;
  dst->Colors[9].y = 0.59;
  dst->Colors[9].z = 0.98;
  dst->Colors[9].w = 0.67;
  dst->Colors[10].x = 0.96;
  dst->Colors[10].y = 0.96;
  dst->Colors[10].z = 0.96;
  dst->Colors[10].w = 1.0;
  dst->Colors[0xb].x = 0.82;
  dst->Colors[0xb].y = 0.82;
  dst->Colors[0xb].z = 0.82;
  dst->Colors[0xb].w = 1.0;
  dst->Colors[0xc].x = 1.0;
  dst->Colors[0xc].y = 1.0;
  dst->Colors[0xc].z = 1.0;
  dst->Colors[0xc].w = 0.51;
  dst->Colors[0xd].x = 0.86;
  dst->Colors[0xd].y = 0.86;
  dst->Colors[0xd].z = 0.86;
  dst->Colors[0xd].w = 1.0;
  dst->Colors[0xe].x = 0.98;
  dst->Colors[0xe].y = 0.98;
  dst->Colors[0xe].z = 0.98;
  dst->Colors[0xe].w = 0.53;
  dst->Colors[0xf].x = 0.69;
  dst->Colors[0xf].y = 0.69;
  dst->Colors[0xf].z = 0.69;
  dst->Colors[0xf].w = 0.8;
  dst->Colors[0x10].x = 0.49;
  dst->Colors[0x10].y = 0.49;
  dst->Colors[0x10].z = 0.49;
  dst->Colors[0x10].w = 0.8;
  dst->Colors[0x11].x = 0.49;
  dst->Colors[0x11].y = 0.49;
  dst->Colors[0x11].z = 0.49;
  dst->Colors[0x11].w = 1.0;
  dst->Colors[0x12].x = 0.26;
  dst->Colors[0x12].y = 0.59;
  dst->Colors[0x12].z = 0.98;
  dst->Colors[0x12].w = 1.0;
  dst->Colors[0x13].x = 0.26;
  dst->Colors[0x13].y = 0.59;
  dst->Colors[0x13].z = 0.98;
  dst->Colors[0x13].w = 0.78;
  dst->Colors[0x14].x = 0.46;
  dst->Colors[0x14].y = 0.54;
  dst->Colors[0x14].z = 0.8;
  dst->Colors[0x14].w = 0.6;
  dst->Colors[0x15].x = 0.26;
  dst->Colors[0x15].y = 0.59;
  dst->Colors[0x15].z = 0.98;
  dst->Colors[0x15].w = 0.4;
  dst->Colors[0x16].x = 0.26;
  dst->Colors[0x16].y = 0.59;
  dst->Colors[0x16].z = 0.98;
  dst->Colors[0x16].w = 1.0;
  dst->Colors[0x17].x = 0.06;
  dst->Colors[0x17].y = 0.53;
  dst->Colors[0x17].z = 0.98;
  dst->Colors[0x17].w = 1.0;
  dst->Colors[0x18].x = 0.26;
  dst->Colors[0x18].y = 0.59;
  dst->Colors[0x18].z = 0.98;
  dst->Colors[0x18].w = 0.31;
  dst->Colors[0x19].x = 0.26;
  dst->Colors[0x19].y = 0.59;
  dst->Colors[0x19].z = 0.98;
  dst->Colors[0x19].w = 0.8;
  dst->Colors[0x1a].x = 0.26;
  dst->Colors[0x1a].y = 0.59;
  dst->Colors[0x1a].z = 0.98;
  dst->Colors[0x1a].w = 1.0;
  dst->Colors[0x1b].x = 0.39;
  dst->Colors[0x1b].y = 0.39;
  dst->Colors[0x1b].z = 0.39;
  dst->Colors[0x1b].w = 0.62;
  dst->Colors[0x1c].x = 0.14;
  dst->Colors[0x1c].y = 0.44;
  dst->Colors[0x1c].z = 0.8;
  dst->Colors[0x1c].w = 0.78;
  dst->Colors[0x1d].x = 0.14;
  dst->Colors[0x1d].y = 0.44;
  dst->Colors[0x1d].z = 0.8;
  dst->Colors[0x1d].w = 1.0;
  dst->Colors[0x1e].x = 0.35;
  dst->Colors[0x1e].y = 0.35;
  dst->Colors[0x1e].z = 0.35;
  dst->Colors[0x1e].w = 0.17;
  dst->Colors[0x1f].x = 0.26;
  dst->Colors[0x1f].y = 0.59;
  dst->Colors[0x1f].z = 0.98;
  dst->Colors[0x1f].w = 0.67;
  dst->Colors[0x20].x = 0.26;
  dst->Colors[0x20].y = 0.59;
  dst->Colors[0x20].z = 0.98;
  dst->Colors[0x20].w = 0.95;
  dst->Colors[0x21].x = 0.764;
  dst->Colors[0x21].y = 0.797;
  dst->Colors[0x21].z = 0.836;
  dst->Colors[0x21].w = 0.931;
  fVar1 = dst->Colors[0x19].y;
  fVar2 = dst->Colors[0x19].z;
  fVar3 = dst->Colors[0x19].w;
  dst->Colors[0x22].x = dst->Colors[0x19].x;
  dst->Colors[0x22].y = fVar1;
  dst->Colors[0x22].z = fVar2;
  dst->Colors[0x22].w = fVar3;
  dst->Colors[0x23].x = 0.596;
  dst->Colors[0x23].y = 0.728;
  dst->Colors[0x23].z = 0.884;
  dst->Colors[0x23].w = 1.0;
  dst->Colors[0x24].x = 0.9208;
  dst->Colors[0x24].y = 0.9274;
  dst->Colors[0x24].z = 0.9352;
  dst->Colors[0x24].w = 0.9862;
  dst->Colors[0x25].x = 0.7416;
  dst->Colors[0x25].y = 0.8208;
  dst->Colors[0x25].z = 0.9144;
  dst->Colors[0x25].w = 1.0;
  dst->Colors[0x26].x = 0.26;
  dst->Colors[0x26].y = 0.59;
  dst->Colors[0x26].z = 0.98;
  dst->Colors[0x26].w = 0.217;
  dst->Colors[0x27].x = 0.2;
  dst->Colors[0x27].y = 0.2;
  dst->Colors[0x27].z = 0.2;
  dst->Colors[0x27].w = 1.0;
  dst->Colors[0x28].x = 0.39;
  dst->Colors[0x28].y = 0.39;
  dst->Colors[0x28].z = 0.39;
  dst->Colors[0x28].w = 1.0;
  dst->Colors[0x29].x = 1.0;
  dst->Colors[0x29].y = 0.43;
  dst->Colors[0x29].z = 0.35;
  dst->Colors[0x29].w = 1.0;
  *(undefined8 *)(dst->Colors + 0x2a) = 0x3f3333333f666666;
  dst->Colors[0x2a].z = 0.0;
  dst->Colors[0x2a].w = 1.0;
  dst->Colors[0x2b].x = 1.0;
  dst->Colors[0x2b].y = 0.45;
  dst->Colors[0x2b].z = 0.0;
  dst->Colors[0x2b].w = 1.0;
  dst->Colors[0x2c].x = 0.78;
  dst->Colors[0x2c].y = 0.87;
  dst->Colors[0x2c].z = 0.98;
  dst->Colors[0x2c].w = 1.0;
  dst->Colors[0x2d].x = 0.57;
  dst->Colors[0x2d].y = 0.57;
  dst->Colors[0x2d].z = 0.64;
  dst->Colors[0x2d].w = 1.0;
  dst->Colors[0x2e].x = 0.68;
  dst->Colors[0x2e].y = 0.68;
  dst->Colors[0x2e].z = 0.74;
  dst->Colors[0x2e].w = 1.0;
  dst->Colors[0x2f].x = 0.0;
  dst->Colors[0x2f].y = 0.0;
  dst->Colors[0x2f].z = 0.0;
  dst->Colors[0x2f].w = 0.0;
  dst->Colors[0x30].x = 0.3;
  dst->Colors[0x30].y = 0.3;
  dst->Colors[0x30].z = 0.3;
  dst->Colors[0x30].w = 0.09;
  dst->Colors[0x31].x = 0.26;
  dst->Colors[0x31].y = 0.59;
  dst->Colors[0x31].z = 0.98;
  dst->Colors[0x31].w = 0.35;
  dst->Colors[0x32].x = 0.26;
  dst->Colors[0x32].y = 0.59;
  dst->Colors[0x32].z = 0.98;
  dst->Colors[0x32].w = 0.95;
  fVar1 = dst->Colors[0x19].y;
  fVar2 = dst->Colors[0x19].z;
  fVar3 = dst->Colors[0x19].w;
  dst->Colors[0x33].x = dst->Colors[0x19].x;
  dst->Colors[0x33].y = fVar1;
  dst->Colors[0x33].z = fVar2;
  dst->Colors[0x33].w = fVar3;
  dst->Colors[0x34].x = 0.7;
  dst->Colors[0x34].y = 0.7;
  dst->Colors[0x34].z = 0.7;
  dst->Colors[0x34].w = 0.7;
  dst->Colors[0x35].x = 0.2;
  dst->Colors[0x35].y = 0.2;
  dst->Colors[0x35].z = 0.2;
  dst->Colors[0x35].w = 0.2;
  dst->Colors[0x36].x = 0.2;
  dst->Colors[0x36].y = 0.2;
  dst->Colors[0x36].z = 0.2;
  dst->Colors[0x36].w = 0.35;
  return;
}

Assistant:

void ImGui::StyleColorsLight(ImGuiStyle* dst)
{
    ImGuiStyle* style = dst ? dst : &ImGui::GetStyle();
    ImVec4* colors = style->Colors;

    colors[ImGuiCol_Text]                   = ImVec4(0.00f, 0.00f, 0.00f, 1.00f);
    colors[ImGuiCol_TextDisabled]           = ImVec4(0.60f, 0.60f, 0.60f, 1.00f);
    colors[ImGuiCol_WindowBg]               = ImVec4(0.94f, 0.94f, 0.94f, 1.00f);
    colors[ImGuiCol_ChildBg]                = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    colors[ImGuiCol_PopupBg]                = ImVec4(1.00f, 1.00f, 1.00f, 0.98f);
    colors[ImGuiCol_Border]                 = ImVec4(0.00f, 0.00f, 0.00f, 0.30f);
    colors[ImGuiCol_BorderShadow]           = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    colors[ImGuiCol_FrameBg]                = ImVec4(1.00f, 1.00f, 1.00f, 1.00f);
    colors[ImGuiCol_FrameBgHovered]         = ImVec4(0.26f, 0.59f, 0.98f, 0.40f);
    colors[ImGuiCol_FrameBgActive]          = ImVec4(0.26f, 0.59f, 0.98f, 0.67f);
    colors[ImGuiCol_TitleBg]                = ImVec4(0.96f, 0.96f, 0.96f, 1.00f);
    colors[ImGuiCol_TitleBgActive]          = ImVec4(0.82f, 0.82f, 0.82f, 1.00f);
    colors[ImGuiCol_TitleBgCollapsed]       = ImVec4(1.00f, 1.00f, 1.00f, 0.51f);
    colors[ImGuiCol_MenuBarBg]              = ImVec4(0.86f, 0.86f, 0.86f, 1.00f);
    colors[ImGuiCol_ScrollbarBg]            = ImVec4(0.98f, 0.98f, 0.98f, 0.53f);
    colors[ImGuiCol_ScrollbarGrab]          = ImVec4(0.69f, 0.69f, 0.69f, 0.80f);
    colors[ImGuiCol_ScrollbarGrabHovered]   = ImVec4(0.49f, 0.49f, 0.49f, 0.80f);
    colors[ImGuiCol_ScrollbarGrabActive]    = ImVec4(0.49f, 0.49f, 0.49f, 1.00f);
    colors[ImGuiCol_CheckMark]              = ImVec4(0.26f, 0.59f, 0.98f, 1.00f);
    colors[ImGuiCol_SliderGrab]             = ImVec4(0.26f, 0.59f, 0.98f, 0.78f);
    colors[ImGuiCol_SliderGrabActive]       = ImVec4(0.46f, 0.54f, 0.80f, 0.60f);
    colors[ImGuiCol_Button]                 = ImVec4(0.26f, 0.59f, 0.98f, 0.40f);
    colors[ImGuiCol_ButtonHovered]          = ImVec4(0.26f, 0.59f, 0.98f, 1.00f);
    colors[ImGuiCol_ButtonActive]           = ImVec4(0.06f, 0.53f, 0.98f, 1.00f);
    colors[ImGuiCol_Header]                 = ImVec4(0.26f, 0.59f, 0.98f, 0.31f);
    colors[ImGuiCol_HeaderHovered]          = ImVec4(0.26f, 0.59f, 0.98f, 0.80f);
    colors[ImGuiCol_HeaderActive]           = ImVec4(0.26f, 0.59f, 0.98f, 1.00f);
    colors[ImGuiCol_Separator]              = ImVec4(0.39f, 0.39f, 0.39f, 0.62f);
    colors[ImGuiCol_SeparatorHovered]       = ImVec4(0.14f, 0.44f, 0.80f, 0.78f);
    colors[ImGuiCol_SeparatorActive]        = ImVec4(0.14f, 0.44f, 0.80f, 1.00f);
    colors[ImGuiCol_ResizeGrip]             = ImVec4(0.35f, 0.35f, 0.35f, 0.17f);
    colors[ImGuiCol_ResizeGripHovered]      = ImVec4(0.26f, 0.59f, 0.98f, 0.67f);
    colors[ImGuiCol_ResizeGripActive]       = ImVec4(0.26f, 0.59f, 0.98f, 0.95f);
    colors[ImGuiCol_Tab]                    = ImLerp(colors[ImGuiCol_Header],       colors[ImGuiCol_TitleBgActive], 0.90f);
    colors[ImGuiCol_TabHovered]             = colors[ImGuiCol_HeaderHovered];
    colors[ImGuiCol_TabActive]              = ImLerp(colors[ImGuiCol_HeaderActive], colors[ImGuiCol_TitleBgActive], 0.60f);
    colors[ImGuiCol_TabUnfocused]           = ImLerp(colors[ImGuiCol_Tab],          colors[ImGuiCol_TitleBg], 0.80f);
    colors[ImGuiCol_TabUnfocusedActive]     = ImLerp(colors[ImGuiCol_TabActive],    colors[ImGuiCol_TitleBg], 0.40f);
    colors[ImGuiCol_DockingPreview]         = colors[ImGuiCol_Header] * ImVec4(1.0f, 1.0f, 1.0f, 0.7f);
    colors[ImGuiCol_DockingEmptyBg]         = ImVec4(0.20f, 0.20f, 0.20f, 1.00f);
    colors[ImGuiCol_PlotLines]              = ImVec4(0.39f, 0.39f, 0.39f, 1.00f);
    colors[ImGuiCol_PlotLinesHovered]       = ImVec4(1.00f, 0.43f, 0.35f, 1.00f);
    colors[ImGuiCol_PlotHistogram]          = ImVec4(0.90f, 0.70f, 0.00f, 1.00f);
    colors[ImGuiCol_PlotHistogramHovered]   = ImVec4(1.00f, 0.45f, 0.00f, 1.00f);
    colors[ImGuiCol_TableHeaderBg]          = ImVec4(0.78f, 0.87f, 0.98f, 1.00f);
    colors[ImGuiCol_TableBorderStrong]      = ImVec4(0.57f, 0.57f, 0.64f, 1.00f);   // Prefer using Alpha=1.0 here
    colors[ImGuiCol_TableBorderLight]       = ImVec4(0.68f, 0.68f, 0.74f, 1.00f);   // Prefer using Alpha=1.0 here
    colors[ImGuiCol_TableRowBg]             = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    colors[ImGuiCol_TableRowBgAlt]          = ImVec4(0.30f, 0.30f, 0.30f, 0.09f);
    colors[ImGuiCol_TextSelectedBg]         = ImVec4(0.26f, 0.59f, 0.98f, 0.35f);
    colors[ImGuiCol_DragDropTarget]         = ImVec4(0.26f, 0.59f, 0.98f, 0.95f);
    colors[ImGuiCol_NavHighlight]           = colors[ImGuiCol_HeaderHovered];
    colors[ImGuiCol_NavWindowingHighlight]  = ImVec4(0.70f, 0.70f, 0.70f, 0.70f);
    colors[ImGuiCol_NavWindowingDimBg]      = ImVec4(0.20f, 0.20f, 0.20f, 0.20f);
    colors[ImGuiCol_ModalWindowDimBg]       = ImVec4(0.20f, 0.20f, 0.20f, 0.35f);
}